

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O0

void chatra::emb::math::math_ldexp(Ct *ct)

{
  int __exponent;
  double __x;
  Ct *ct_local;
  
  __x = getDouble(ct,0);
  __exponent = getInt(ct,1);
  ldexp(__x,__exponent);
  (*ct->_vptr_NativeCallContext[0xf])();
  return;
}

Assistant:

static void math_ldexp(Ct& ct) {
	ct.setFloat(std::ldexp(getDouble(ct, 0), getInt(ct, 1)));
}